

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O1

SearchStatus __thiscall tsbp::LeftmostActiveOnly::Solve(LeftmostActiveOnly *this)

{
  int iVar1;
  pointer __first;
  int iVar2;
  SearchStatus SVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  pointer piVar7;
  double dVar8;
  vector<int,_std::allocator<int>_> itemOrder;
  allocator_type local_49;
  vector<int,_std::allocator<int>_> local_48;
  
  lVar4 = std::chrono::_V2::steady_clock::now();
  iVar1 = (this->parameters).LMAOThreads;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,
             (long)(this->items).
                   super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->items).
                   super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>._M_impl.
                   super__Vector_impl_data._M_start >> 5,&local_49);
  __first = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    iVar2 = 0;
    piVar7 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    do {
      *piVar7 = iVar2;
      iVar2 = iVar2 + 1;
      piVar7 = piVar7 + 1;
    } while (piVar7 != local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      uVar5 = (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2;
      lVar6 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<tsbp::CompareLexicographicDxDy>>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(ulong)(((uint)lVar6 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<tsbp::CompareLexicographicDxDy>)&this->items);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<tsbp::CompareLexicographicDxDy>>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (_Iter_comp_iter<tsbp::CompareLexicographicDxDy>)&this->items);
    }
  }
  std::vector<int,_std::allocator<int>_>::operator=(&this->branchingOrder,&local_48);
  if (iVar1 == 1) {
    SVar3 = SolveSequential(this);
    (this->statistics).NodeCount =
         (int)((ulong)((long)(this->tree).super_type.m_vertices.
                             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->tree).super_type.m_vertices.
                            super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555;
  }
  else if (iVar1 < 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Invalid number of threads parameter, solve in sequential mode.\n",0x3f);
    SVar3 = SolveSequential(this);
  }
  else {
    SVar3 = SolveParallelTaskflow(this);
  }
  lVar6 = std::chrono::_V2::steady_clock::now();
  (this->statistics).TimeOverall = (double)((lVar6 - lVar4) / 1000000);
  dVar8 = MemoryUsedByCurrentProcess();
  (this->statistics).MemoryUsage = dVar8;
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return SVar3;
}

Assistant:

SearchStatus LeftmostActiveOnly::Solve()
{
    auto start = std::chrono::steady_clock::now();

    int numberOfThreads = this->parameters.LMAOThreads;
    SearchStatus searchStatus = SearchStatus::None;

    std::vector<int> itemOrder(items.size());
    std::iota(itemOrder.begin(), itemOrder.end(), 0);
    std::sort(itemOrder.begin(), itemOrder.end(), CompareLexicographicDxDy(&items));

    this->branchingOrder = itemOrder;

    if (numberOfThreads == 1)
    {
        searchStatus = SolveSequential();
        this->statistics.NodeCount = this->tree.m_vertices.size();
    }
    else if (numberOfThreads >= 1)
    {
        searchStatus = SolveParallelTaskflow();
        // Slightly inferior performance compared to taskflow with this memory allocator. Cannot limit threads.
        ////searchStatus = SolveParallelNative();
    }
    else
    {
        std::cout << "Invalid number of threads parameter, solve in sequential mode.\n";
        searchStatus = SolveSequential();
    }

    auto end = std::chrono::steady_clock::now();
    auto time = std::chrono::duration_cast<std::chrono::milliseconds>(end - start).count();

    this->statistics.TimeOverall = time;
    this->statistics.MemoryUsage = MemoryUsedByCurrentProcess();

    return searchStatus;
}